

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearize.c
# Opt level: O3

void dmrC_init_linearizer(dmr_C *C)

{
  linearizer_state_t *A;
  
  A = (linearizer_state_t *)calloc(1,0x4d78);
  dmrC_allocator_init(&A->asm_rules_allocator,"asm rules",0x18,8,0x8000);
  dmrC_allocator_init((allocator *)A,"pseudos",0x38,8,0x8000);
  dmrC_allocator_init(&A->pseudo_user_allocator,"pseudo_users",0x10,8,0x8000);
  dmrC_allocator_init(&A->asm_constraint_allocator,"asm_constraints",0x18,8,0x8000);
  dmrC_allocator_init(&A->multijmp_allocator,"multijmps",0x18,8,0x8000);
  dmrC_allocator_init(&A->basic_block_allocator,"basic_blocks",0x58,8,0x8000);
  dmrC_allocator_init(&A->entrypoint_allocator,"entrypoints",0x30,8,0x8000);
  dmrC_allocator_init(&A->instruction_allocator,"instructions",0x40,8,0x8000);
  C->L = A;
  return;
}

Assistant:

void dmrC_init_linearizer(struct dmr_C *C) {
	struct linearizer_state_t *L = (struct linearizer_state_t *)calloc(1, sizeof(struct linearizer_state_t));
	dmrC_allocator_init(&L->asm_rules_allocator, "asm rules", sizeof(struct asm_rules),
		__alignof__(struct asm_rules), CHUNK);
	dmrC_allocator_init(&L->pseudo_allocator, "pseudos", sizeof(struct pseudo),
		__alignof__(struct pseudo), CHUNK);
	dmrC_allocator_init(&L->pseudo_user_allocator, "pseudo_users", sizeof(struct pseudo_user),
		__alignof__(struct pseudo_user), CHUNK);
	dmrC_allocator_init(&L->asm_constraint_allocator, "asm_constraints", sizeof(struct asm_constraint),
		__alignof__(struct asm_constraint), CHUNK);
	dmrC_allocator_init(&L->multijmp_allocator, "multijmps", sizeof(struct multijmp),
		__alignof__(struct multijmp), CHUNK);
	dmrC_allocator_init(&L->basic_block_allocator, "basic_blocks", sizeof(struct basic_block),
		__alignof__(struct basic_block), CHUNK);
	dmrC_allocator_init(&L->entrypoint_allocator, "entrypoints", sizeof(struct entrypoint),
		__alignof__(struct entrypoint), CHUNK);
	dmrC_allocator_init(&L->instruction_allocator, "instructions", sizeof(struct instruction),
		__alignof__(struct instruction), CHUNK);
	C->L = L;
}